

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O3

bool __thiscall ON_BrepEdgeArray::Read(ON_BrepEdgeArray *this,ON_BinaryArchive *file)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  ON_BrepEdge *pOVar5;
  int iVar6;
  int count;
  int major_version;
  int minor_version;
  ON__UINT32 tcode;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK;
  ON__INT32 local_38;
  int local_34 [3];
  ON__INT64 local_28;
  
  ON_ClassArray<ON_BrepEdge>::Empty((ON_ClassArray<ON_BrepEdge> *)this);
  bVar3 = false;
  local_34[2] = 0;
  local_28 = 0;
  local_38 = 0;
  local_34[0] = 0;
  local_34[1] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmBigChunk(file,(uint *)(local_34 + 2),&local_28);
  if (bVar1) {
    if (local_34[2] == 0x40008000) {
      bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,local_34,local_34 + 1);
      bVar2 = 0;
      if ((bVar1) && (bVar2 = 0, local_34[0] == 1)) {
        bVar2 = ON_BinaryArchive::ReadInt(file,&local_38);
        ON_ClassArray<ON_BrepEdge>::SetCapacity((ON_ClassArray<ON_BrepEdge> *)this,(long)local_38);
        if (((bool)bVar2) && (0 < local_38)) {
          iVar6 = 1;
          do {
            pOVar5 = ON_ClassArray<ON_BrepEdge>::AppendNew((ON_ClassArray<ON_BrepEdge> *)this);
            iVar4 = (*(pOVar5->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object
                      ._vptr_ON_Object[0xb])(pOVar5,file);
            bVar2 = (byte)iVar4;
            if (bVar2 == 0) break;
            bVar1 = iVar6 < local_38;
            iVar6 = iVar6 + 1;
          } while (bVar1);
        }
      }
    }
    else {
      bVar2 = 0;
    }
    bVar3 = ON_BinaryArchive::EndRead3dmChunk(file);
    bVar3 = (bool)(bVar3 & bVar2);
  }
  return bVar3;
}

Assistant:

bool ON_BrepEdgeArray::Read( ON_BinaryArchive& file )
{
  Empty();
  ON__UINT32 tcode = 0;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK = 0;
  int count = 0;
  int i;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.BeginRead3dmBigChunk( &tcode, &length_TCODE_ANONYMOUS_CHUNK );
  if (rc) {
    if (tcode != TCODE_ANONYMOUS_CHUNK)
      rc = false;
    if (rc) rc = file.Read3dmChunkVersion(&major_version,&minor_version);
    if (rc) {
      if ( major_version==1 ) {
        if (rc) rc = file.ReadInt(&count);
        SetCapacity(count);
        for ( i = 0; i < count && rc ; i++ ) {
          ON_BrepEdge& edge = AppendNew();
          rc = edge.Read(file) ? true : false;
        }    
      }
      else {
        rc = 0;
      }
    }
    if ( !file.EndRead3dmChunk() )
      rc = false;
  }
  return rc;
}